

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.cpp
# Opt level: O1

bool __thiscall ZXing::BitMatrix::getBottomRightOnBit(BitMatrix *this,int *right,int *bottom)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  long lVar7;
  
  puVar1 = (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar7 = (long)puVar2 - (long)puVar1 >> 2;
  puVar5 = puVar2;
  if (0 < lVar7) {
    puVar5 = puVar2 + lVar7 * -4;
    puVar4 = puVar2 + -1;
    lVar7 = lVar7 + 1;
    puVar6 = puVar2;
    do {
      iVar3 = (int)puVar6;
      if (*puVar4 != '\0') goto LAB_00131467;
      if (puVar4[-1] != '\0') {
        iVar3 = iVar3 + -1;
        goto LAB_00131467;
      }
      if (puVar4[-2] != '\0') {
        iVar3 = iVar3 + -2;
        goto LAB_00131467;
      }
      if (puVar4[-3] != '\0') {
        iVar3 = iVar3 + -3;
        goto LAB_00131467;
      }
      puVar6 = puVar6 + -4;
      puVar4 = puVar4 + -4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)puVar5 - (long)puVar1;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      iVar3 = (int)puVar1;
      if ((lVar7 != 3) || (iVar3 = (int)puVar5, puVar5[-1] != '\0')) goto LAB_00131467;
      puVar5 = puVar5 + -1;
    }
    if (puVar5[-1] != '\0') {
      iVar3 = (int)puVar5;
      goto LAB_00131467;
    }
    puVar5 = puVar5 + -1;
  }
  puVar4 = puVar1;
  if (puVar5[-1] != '\0') {
    puVar4 = puVar5;
  }
  iVar3 = (int)puVar4;
LAB_00131467:
  iVar3 = ~((int)puVar2 - iVar3) + (int)((long)puVar2 - (long)puVar1);
  if (-1 < iVar3) {
    *bottom = iVar3 / this->_width;
    *right = iVar3 % this->_width;
  }
  return -1 < iVar3;
}

Assistant:

bool
BitMatrix::getBottomRightOnBit(int& right, int& bottom) const
{
	int bitsOffset = Size(_bits) - 1 - (int)std::distance(_bits.rbegin(), std::find_if(_bits.rbegin(), _bits.rend(), isSet));
	if (bitsOffset < 0) {
		return false;
	}

	bottom = bitsOffset / _width;
	right = (bitsOffset % _width);
	return true;
}